

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomAction::read(DomAction *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  int iVar2;
  DomProperty *pDVar3;
  char16_t *pcVar4;
  void *__buf_00;
  void *__buf_01;
  long lVar5;
  undefined4 in_register_00000034;
  QList<DomProperty_*> *this_00;
  long in_FS_OFFSET;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar5 = 0;
    do {
      local_68.m_data = *(storage_type_conflict **)(local_50.ptr + lVar5 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x10);
      if ((local_68.m_size == 4) &&
         (QVar6.m_data = local_68.m_data, QVar6.m_size = 4, QVar8.m_data = L"name", QVar8.m_size = 4
         , cVar1 = QtPrivate::equalStrings(QVar6,QVar8), cVar1 != '\0')) {
        QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar5 + 0x50),
                         *(longlong *)(local_50.ptr + lVar5 + 0x58));
        QString::operator=(&this->m_attr_name,&local_80);
        this->m_has_attr_name = true;
      }
      else if ((local_68.m_size == 4) &&
              (QVar7.m_data = local_68.m_data, QVar7.m_size = 4, QVar9.m_data = L"menu",
              QVar9.m_size = 4, cVar1 = QtPrivate::equalStrings(QVar7,QVar9), cVar1 != '\0')) {
        QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar5 + 0x50),
                         *(longlong *)(local_50.ptr + lVar5 + 0x58));
        QString::operator=(&this->m_attr_menu,&local_80);
        this->m_has_attr_menu = true;
      }
      else {
        local_98.a.m_size = 0x15;
        local_98.a.m_data = "Unexpected attribute ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>(&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
      }
      if ((DomProperty *)local_80.d.d != (DomProperty *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar5 = lVar5 + 0x68;
    } while (local_50.size * 0x68 - lVar5 != 0);
  }
  iVar2 = QXmlStreamReader::error();
  if (iVar2 == 0) {
    do {
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 == 4) {
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = (QStringView)QXmlStreamReader::name();
        QVar10.m_data = L"property";
        QVar10.m_size = 8;
        pcVar4 = L"property";
        iVar2 = QtPrivate::compareStrings(local_68,QVar10,CaseInsensitive);
        if (iVar2 == 0) {
          pDVar3 = (DomProperty *)operator_new(0x178);
          memset(pDVar3,0,0x178);
          DomProperty::read(pDVar3,__fd,__buf_00,(size_t)pcVar4);
          local_80.d.d = (Data *)pDVar3;
          QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
                    ((QPodArrayOps<DomProperty*> *)&this->m_property,(this->m_property).d.size,
                     (DomProperty **)&local_80);
          this_00 = &this->m_property;
        }
        else {
          QVar11.m_data = L"attribute";
          QVar11.m_size = 9;
          pcVar4 = L"attribute";
          iVar2 = QtPrivate::compareStrings(local_68,QVar11,CaseInsensitive);
          if (iVar2 != 0) {
            local_98.a.m_size = 0x13;
            local_98.a.m_data = "Unexpected element ";
            local_98.b = &local_68;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      (&local_80,&local_98);
            QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
            if ((DomProperty *)local_80.d.d != (DomProperty *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
              }
            }
            goto LAB_0015b16f;
          }
          pDVar3 = (DomProperty *)operator_new(0x178);
          memset(pDVar3,0,0x178);
          DomProperty::read(pDVar3,__fd,__buf_01,(size_t)pcVar4);
          local_80.d.d = (Data *)pDVar3;
          QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
                    ((QPodArrayOps<DomProperty*> *)&this->m_attribute,(this->m_attribute).d.size,
                     (DomProperty **)&local_80);
          this_00 = &this->m_attribute;
        }
        QList<DomProperty_*>::end(this_00);
      }
      else if (iVar2 == 5) break;
LAB_0015b16f:
      iVar2 = QXmlStreamReader::error();
    } while (iVar2 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomAction::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        if (name == u"menu"_s) {
            setAttributeMenu(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}